

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow_conflict *window,_Bool add_to_tab_bar)

{
  float fVar1;
  long lVar2;
  long lVar3;
  ImGuiTabBar *tab_bar;
  long lVar4;
  _Bool _Var5;
  ImGuiWindow_conflict **ppIVar6;
  bool bVar7;
  int local_2c;
  int n;
  ImGuiContext_conflict *g;
  ImGuiWindow *pIStack_18;
  _Bool add_to_tab_bar_local;
  ImGuiWindow_conflict *window_local;
  ImGuiDockNode *node_local;
  
  pIStack_18 = (ImGuiWindow *)window;
  window_local = (ImGuiWindow_conflict *)node;
  if (window->DockNode != (ImGuiDockNode *)0x0) {
    if (window->DockNode->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x34ce,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(window->DockNode,window,0);
  }
  bVar7 = true;
  if (pIStack_18->DockNode != (ImGuiDockNode *)0x0) {
    bVar7 = pIStack_18->DockNodeAsHost == (ImGuiDockNode *)0x0;
  }
  if (bVar7) {
    lVar2._0_4_ = window_local->WindowRounding;
    lVar2._4_4_ = window_local->WindowBorderSize;
    if (((lVar2 == 0) && (*(int *)&window_local->Viewport == 1)) &&
       (ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                            ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,0),
       ((*ppIVar6)->WasActive & 1U) == 0)) {
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,0);
      DockNodeHideWindowDuringHostWindowCreation(*ppIVar6);
    }
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,
               (ImGuiWindow_conflict **)&stack0xffffffffffffffe8);
    *(byte *)((long)&(window_local->ScrollbarSizes).x + 2) =
         *(byte *)((long)&(window_local->ScrollbarSizes).x + 2) & 0xfd | 2;
    pIStack_18->DockNode = (ImGuiDockNode *)window_local;
    pIStack_18->DockId = *(ImGuiID *)&window_local->Name;
    pIStack_18->field_0x3e1 = pIStack_18->field_0x3e1 & 0xfe | 1 < *(int *)&window_local->Viewport;
    pIStack_18->field_0x3e1 = pIStack_18->field_0x3e1 & 0xf7;
    lVar3._0_4_ = window_local->WindowRounding;
    lVar3._4_4_ = window_local->WindowBorderSize;
    if ((lVar3 == 0) &&
       (_Var5 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)window_local), _Var5)) {
      if ((short)(*(short *)&(window_local->ScrollbarSizes).x << 0xd) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).x =
             *(ushort *)&(window_local->ScrollbarSizes).x & 0xfff8 | 2;
      }
      if ((short)(*(short *)&(window_local->ScrollbarSizes).x << 10) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).x =
             *(ushort *)&(window_local->ScrollbarSizes).x & 0xffc7 | 0x10;
      }
      if ((short)(*(short *)&(window_local->ScrollbarSizes).x << 7) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).x =
             *(ushort *)&(window_local->ScrollbarSizes).x & 0xfe3f | 0x80;
      }
    }
    if (add_to_tab_bar) {
      if (*(long *)&(window_local->ViewportPos).y == 0) {
        DockNodeAddTabBar((ImGuiDockNode *)window_local);
        fVar1 = (window_local->ScrollTargetEdgeSnapDist).x;
        *(float *)(*(long *)&(window_local->ViewportPos).y + 0x1c) = fVar1;
        *(float *)(*(long *)&(window_local->ViewportPos).y + 0x18) = fVar1;
        for (local_2c = 0; local_2c < *(int *)&window_local->Viewport + -1; local_2c = local_2c + 1)
        {
          tab_bar = *(ImGuiTabBar **)&(window_local->ViewportPos).y;
          ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                              ((ImVector<ImGuiWindow_*> *)&window_local->Viewport,local_2c);
          TabBarAddTab(tab_bar,0,(ImGuiWindow *)*ppIVar6);
        }
      }
      TabBarAddTab(*(ImGuiTabBar **)&(window_local->ViewportPos).y,0x400000,pIStack_18);
    }
    DockNodeUpdateVisibleFlag((ImGuiDockNode *)window_local);
    lVar4._0_4_ = window_local->WindowRounding;
    lVar4._4_4_ = window_local->WindowBorderSize;
    if (lVar4 != 0) {
      UpdateWindowParentAndRootLinks
                ((ImGuiWindow_conflict *)pIStack_18,pIStack_18->Flags | 0x1000000,
                 *(ImGuiWindow_conflict **)&window_local->WindowRounding);
    }
    return;
  }
  __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x34d1,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    // If more than 2 windows appeared on the same frame leading to the creation of a new hosting window,
    // we'll hide windows until the host window is ready. Hide the 1st window after its been output (so it is not visible for one frame).
    // We will call DockNodeHideWindowDuringHostWindowCreation() on ourselves in Begin()
    if (node->HostWindow == NULL && node->Windows.Size == 1 && node->Windows[0]->WasActive == false)
        DockNodeHideWindowDuringHostWindowCreation(node->Windows[0]);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}